

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

int parse_options(cfg_file *cfg,rc_test_config *ea)

{
  int iVar1;
  char *pcVar2;
  int type;
  char *opt;
  rc_test_config *ea_local;
  cfg_file *cfg_local;
  
  while (((pcVar2 = read_cfg_line(cfg), pcVar2 != (char *)0x0 && (*pcVar2 != '\n')) &&
         (*pcVar2 != '['))) {
    iVar1 = lookup_opt_type(pcVar2);
    if (iVar1 == 2) {
      pcVar2 = get_opt_value(pcVar2);
      iVar1 = lookup_opt_type(pcVar2);
      ea->idx_type = iVar1;
    }
    else if (iVar1 == 3) {
      pcVar2 = get_opt_value(pcVar2);
      __isoc99_sscanf(pcVar2,"%d",&ea->loop);
      _mpp_log_l(4,0,"loop num: %d\n",0,ea->loop);
    }
    invalid_cfg_cache(cfg);
  }
  return 0;
}

Assistant:

static int parse_options(struct cfg_file *cfg, struct rc_test_config *ea)
{
    char *opt;
    int type;

    while (1) {
        opt = read_cfg_line(cfg);

        if (opt && opt[0] != '\n' && opt[0] != '[') {
            type = lookup_opt_type(opt);

            switch (type) {
            case OPT_TYPE_INDEX_TYPE:
                ea->idx_type = lookup_opt_type(get_opt_value(opt));
                break;
            case OPT_TYPE_LOOP_NUM:
                sscanf(get_opt_value(opt), "%d", &ea->loop);
                mpp_log("loop num: %d\n", ea->loop);
                break;
            default:
                break;
            }

            invalid_cfg_cache(cfg);
        } else {
            break;
        }
    }
    return 0;
}